

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kliveness.c
# Opt level: O3

void deallocateMasterBarrierDisjunctVecPtrVecInt(Vec_Ptr_t *vMasterBarrierDisjunctsArg)

{
  void *__ptr;
  long lVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  
  if (vMasterBarrierDisjunctsArg == (Vec_Ptr_t *)0x0) {
    return;
  }
  if (0 < vMasterBarrierDisjunctsArg->nSize) {
    lVar4 = 0;
    do {
      __ptr = vMasterBarrierDisjunctsArg->pArray[lVar4];
      if (__ptr == (void *)0x0) {
        __assert_fail("vPtr",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/live/kliveness.c"
                      ,0x1e8,"void deallocateMasterBarrierDisjunctVecPtrVecInt(Vec_Ptr_t *)");
      }
      iVar2 = *(int *)((long)__ptr + 4);
      if (0 < iVar2) {
        lVar5 = 0;
        do {
          lVar1 = *(long *)(*(long *)((long)__ptr + 8) + lVar5 * 8);
          if (0 < *(int *)(lVar1 + 4)) {
            lVar3 = 0;
            do {
              printf("%d - ",(ulong)*(uint *)(*(long *)(lVar1 + 8) + lVar3 * 4));
              lVar3 = lVar3 + 1;
            } while (lVar3 < *(int *)(lVar1 + 4));
            iVar2 = *(int *)((long)__ptr + 4);
          }
          lVar5 = lVar5 + 1;
        } while (lVar5 < iVar2);
      }
      if (*(void **)((long)__ptr + 8) != (void *)0x0) {
        free(*(void **)((long)__ptr + 8));
      }
      free(__ptr);
      lVar4 = lVar4 + 1;
    } while (lVar4 < vMasterBarrierDisjunctsArg->nSize);
  }
  if (vMasterBarrierDisjunctsArg->pArray != (void **)0x0) {
    free(vMasterBarrierDisjunctsArg->pArray);
  }
  free(vMasterBarrierDisjunctsArg);
  return;
}

Assistant:

void deallocateMasterBarrierDisjunctVecPtrVecInt(Vec_Ptr_t *vMasterBarrierDisjunctsArg)
{
	Vec_Int_t *vInt;
	Vec_Ptr_t *vPtr;
	int i, j, k, iElem;

	if(vMasterBarrierDisjunctsArg)
	{
		Vec_PtrForEachEntry(Vec_Ptr_t *, vMasterBarrierDisjunctsArg, vPtr, i)
		{	
			assert(vPtr);
			Vec_PtrForEachEntry( Vec_Int_t *, vPtr, vInt, j )
			{
				//Vec_IntFree(vInt);
				Vec_IntForEachEntry( vInt, iElem, k )
					printf("%d - ", iElem);
				//printf("Chung Chang j = %d\n", j);
			}
			Vec_PtrFree(vPtr);
		}
		Vec_PtrFree(vMasterBarrierDisjunctsArg);
	}
}